

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O0

JDIMENSION get_8bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  undefined1 *puVar4;
  long in_RSI;
  long *in_RDI;
  int cmaplen;
  JSAMPARRAY colormap;
  JDIMENSION col;
  JSAMPROW ptr;
  int t;
  tga_source_ptr source;
  int local_2c;
  undefined1 *local_28;
  
  plVar2 = *(long **)(in_RSI + 0x38);
  iVar1 = *(int *)(in_RSI + 0x60);
  local_28 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  for (local_2c = (int)in_RDI[6]; local_2c != 0; local_2c = local_2c + -1) {
    (**(code **)(in_RSI + 0x50))(in_RSI);
    uVar3 = (uint)*(byte *)(in_RSI + 0x58);
    if (iVar1 <= (int)uVar3) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x40d;
      (**(code **)*in_RDI)(in_RDI);
    }
    *local_28 = *(undefined1 *)(*plVar2 + (long)(int)uVar3);
    puVar4 = local_28 + 2;
    local_28[1] = *(undefined1 *)(plVar2[1] + (long)(int)uVar3);
    local_28 = local_28 + 3;
    *puVar4 = *(undefined1 *)(plVar2[2] + (long)(int)uVar3);
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_8bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 8-bit colormap indexes */
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  register int t;
  register JSAMPROW ptr;
  register JDIMENSION col;
  register JSAMPARRAY colormap = source->colormap;
  int cmaplen = source->cmap_length;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    (*source->read_pixel) (source); /* Load next pixel into tga_pixel */
    t = UCH(source->tga_pixel[0]);
    if (t >= cmaplen)
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    *ptr++ = colormap[0][t];
    *ptr++ = colormap[1][t];
    *ptr++ = colormap[2][t];
  }
  return 1;
}